

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O0

void __thiscall
icu_63::UVector::insertElementAt(UVector *this,void *obj,int32_t index,UErrorCode *status)

{
  UBool UVar1;
  int local_2c;
  int32_t i;
  UErrorCode *status_local;
  int32_t index_local;
  void *obj_local;
  UVector *this_local;
  
  if ((-1 < index) && (index <= this->count)) {
    UVar1 = ensureCapacity(this,this->count + 1,status);
    if (UVar1 != '\0') {
      for (local_2c = this->count; index < local_2c; local_2c = local_2c + -1) {
        this->elements[local_2c] = this->elements[local_2c + -1];
      }
      this->elements[index].pointer = obj;
      this->count = this->count + 1;
    }
  }
  return;
}

Assistant:

void UVector::insertElementAt(void* obj, int32_t index, UErrorCode &status) {
    // must have 0 <= index <= count
    if (0 <= index && index <= count && ensureCapacity(count + 1, status)) {
        for (int32_t i=count; i>index; --i) {
            elements[i] = elements[i-1];
        }
        elements[index].pointer = obj;
        ++count;
    }
    /* else index out of range */
}